

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op,
          BaseType input_type,BaseType expected_result_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  bool forwarding;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  string expr;
  string cast_op;
  SPIRType expected_type;
  string local_220;
  string local_200;
  uint32_t local_1dc;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  string local_1b0;
  undefined1 local_190 [208];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,input_type);
  local_1dc = result_type;
  local_1d8 = op;
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op0);
  SPIRType::SPIRType((SPIRType *)local_190,pSVar3);
  local_190._20_4_ = pSVar4->width;
  local_1d0 = local_1c0;
  local_1c8 = 0;
  local_1c0[0] = 0;
  local_190._16_4_ = input_type;
  if (pSVar4->basetype == input_type) {
    to_unpacked_expression_abi_cxx11_(&local_200,this,op0,true);
  }
  else {
    if (pSVar4->basetype == Boolean) {
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_220,this,local_190,0);
      to_unpacked_expression_abi_cxx11_(&local_1b0,this,op0,true);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_200,(spirv_cross *)&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x398789,
                 (char (*) [2])&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,ts_3)
      ;
      ::std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      psVar2 = &local_220;
      local_200._M_dataplus._M_p = local_220._M_dataplus._M_p;
      goto LAB_002d809e;
    }
    bitcast_glsl_abi_cxx11_(&local_200,this,(SPIRType *)local_190,op0);
  }
  ::std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_200);
  psVar2 = &local_200;
LAB_002d809e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &psVar2->field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  paVar1 = &local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_200._M_dataplus._M_p = (pointer)paVar1;
  if (pSVar3->basetype == expected_result_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_220,(spirv_cross *)&local_1d8,(char **)0x398789,(char (*) [2])&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,ts_3);
    ::std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_220._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
  }
  else {
    local_190._16_4_ = expected_result_type;
    local_190._20_4_ = pSVar3->width;
    if (pSVar3->basetype == Boolean) {
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_220,this,pSVar3,0);
    }
    else {
      (*(this->super_Compiler)._vptr_Compiler[0x3c])(&local_220,this,pSVar3,local_190);
    }
    ::std::__cxx11::string::operator=((string *)&local_200,(string *)&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    ::std::__cxx11::string::push_back('\0');
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_220,(spirv_cross *)&local_1d8,(char **)0x398789,(char (*) [2])&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,ts_3);
    ::std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_220._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    ::std::__cxx11::string::push_back('\0');
  }
  forwarding = should_forward(this,op0);
  emit_op(this,local_1dc,result_id,&local_200,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  local_190._0_8_ = &PTR__SPIRType_0048ff28;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_190._160_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_190._152_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0)) {
    free((void *)local_190._152_8_);
  }
  local_190._96_8_ = 0;
  if ((undefined1 *)local_190._88_8_ != local_190 + 0x70) {
    free((void *)local_190._88_8_);
  }
  local_190._40_8_ = 0;
  if ((undefined1 *)local_190._32_8_ != local_190 + 0x38) {
    free((void *)local_190._32_8_);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_unary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op,
                                           SPIRType::BaseType input_type, SPIRType::BaseType expected_result_type)
{
	auto &out_type = get<SPIRType>(result_type);
	auto &expr_type = expression_type(op0);
	auto expected_type = out_type;

	// Bit-widths might be different in unary cases because we use it for SConvert/UConvert and friends.
	expected_type.basetype = input_type;
	expected_type.width = expr_type.width;

	string cast_op;
	if (expr_type.basetype != input_type)
	{
		if (expr_type.basetype == SPIRType::Boolean)
			cast_op = join(type_to_glsl(expected_type), "(", to_unpacked_expression(op0), ")");
		else
			cast_op = bitcast_glsl(expected_type, op0);
	}
	else
		cast_op = to_unpacked_expression(op0);

	string expr;
	if (out_type.basetype != expected_result_type)
	{
		expected_type.basetype = expected_result_type;
		expected_type.width = out_type.width;
		if (out_type.basetype == SPIRType::Boolean)
			expr = type_to_glsl(out_type);
		else
			expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0));
	inherit_expression_dependencies(result_id, op0);
}